

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O1

int32_t u_parseString(char *s,UChar *dest,int32_t destCapacity,uint32_t *pFirst,
                     UErrorCode *pErrorCode)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  char *end;
  byte *local_40;
  UChar *local_38;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0 || s == (char *)0x0) || (dest == (UChar *)0x0 && 0 < destCapacity)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (pFirst != (uint32_t *)0x0) {
        *pFirst = 0xffffffff;
      }
      iVar5 = 0;
LAB_0010b575:
      iVar4 = iVar5;
      for (; uVar3 = (ulong)(byte)*s, uVar3 < 0x3c; s = (char *)((byte *)s + 1)) {
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
          if ((0x800000000000001U >> (uVar3 & 0x3f) & 1) != 0) {
            if (iVar4 < destCapacity) {
              dest[iVar4] = L'\0';
              return iVar4;
            }
            if (iVar4 == destCapacity) {
              *pErrorCode = U_STRING_NOT_TERMINATED_WARNING;
              return iVar4;
            }
            *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
            return iVar4;
          }
          break;
        }
      }
      local_38 = dest;
      uVar3 = strtoul(s,(char **)&local_40,0x10);
      if (s < local_40) {
        bVar1 = *local_40;
        uVar2 = (uint)uVar3;
        if ((((0x3b < (ulong)bVar1) || ((0x800000100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
            (bVar1 != 0)) || (0x10ffff < uVar2)) goto LAB_0010b671;
        if (pFirst != (uint *)0x0) {
          *pFirst = uVar2;
        }
        iVar5 = (iVar4 - (uint)(uVar2 < 0x10000)) + 2;
        pFirst = (uint *)0x0;
        dest = local_38;
        s = (char *)local_40;
        if (iVar5 <= destCapacity) {
          if (uVar2 < 0x10000) {
            iVar5 = iVar4 + 1;
            local_38[iVar4] = (UChar)uVar3;
          }
          else {
            local_38[iVar4] = (short)(uVar3 >> 10) + L'ퟀ';
            iVar5 = iVar4 + 2;
            local_38[(long)iVar4 + 1] = (UChar)uVar3 & 0x3ffU | 0xdc00;
          }
          pFirst = (uint *)0x0;
        }
        goto LAB_0010b575;
      }
LAB_0010b671:
      *pErrorCode = U_PARSE_ERROR;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseString(const char *s,
              UChar *dest, int32_t destCapacity,
              uint32_t *pFirst,
              UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;
    int32_t destLength;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(pFirst!=NULL) {
        *pFirst=0xffffffff;
    }

    destLength=0;
    for(;;) {
        s=u_skipWhitespace(s);
        if(*s==';' || *s==0) {
            if(destLength<destCapacity) {
                dest[destLength]=0;
            } else if(destLength==destCapacity) {
                *pErrorCode=U_STRING_NOT_TERMINATED_WARNING;
            } else {
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            }
            return destLength;
        }

        /* read one code point */
        value=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || (!U_IS_INV_WHITESPACE(*end) && *end!=';' && *end!=0) || value>=0x110000) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }

        /* store the first code point */
        if(pFirst!=NULL) {
            *pFirst=value;
            pFirst=NULL;
        }

        /* append it to the destination array */
        if((destLength+U16_LENGTH(value))<=destCapacity) {
            U16_APPEND_UNSAFE(dest, destLength, value);
        } else {
            destLength+=U16_LENGTH(value);
        }

        /* go to the following characters */
        s=end;
    }
}